

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O2

Nonnull<StatusRep_*> __thiscall
absl::lts_20240722::status_internal::StatusRep::CloneAndUnref(StatusRep *this)

{
  unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
  __p;
  StatusRep *this_00;
  string_view message_arg;
  unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
  payloads;
  unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
  local_20;
  unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
  local_18;
  
  if ((this->ref_).super___atomic_base<int>._M_i != 1) {
    payloads._M_t.
    super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
    .
    super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>,_true,_true>
          )(__uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
            )0x0;
    if ((this->payloads_)._M_t.
        super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
        .
        super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
        ._M_head_impl !=
        (InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
         *)0x0) {
      std::
      make_unique<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,1ul,std::allocator<absl::lts_20240722::status_internal::Payload>>,absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,1ul,std::allocator<absl::lts_20240722::status_internal::Payload>>&>
                ((InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                  *)&stack0xffffffffffffffe8);
      __p._M_t.
      super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
      .
      super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
      ._M_head_impl =
           local_18._M_t.
           super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
           .
           super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
           ._M_head_impl;
      local_18._M_t.
      super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
      .
      super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>,_true,_true>
            )(__uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
              )0x0;
      std::
      __uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
      ::reset((__uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
               *)&payloads,
              (pointer)__p._M_t.
                       super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
                       .
                       super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
                       ._M_head_impl);
      std::
      unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
      ::~unique_ptr(&stack0xffffffffffffffe8);
    }
    this_00 = (StatusRep *)operator_new(0x30);
    local_20 = (unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
                )(unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
                  )payloads._M_t.
                   super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
                   .
                   super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
                   ._M_head_impl;
    payloads._M_t.
    super___uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
    .
    super__Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>,_true,_true>
          )(__uniq_ptr_impl<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
            )0x0;
    message_arg._M_str = (this->message_)._M_dataplus._M_p;
    message_arg._M_len = (this->message_)._M_string_length;
    StatusRep(this_00,this->code_,message_arg,&local_20);
    std::
    unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
    ::~unique_ptr(&local_20);
    Unref(this);
    std::
    unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
    ::~unique_ptr(&payloads);
    this = this_00;
  }
  return this;
}

Assistant:

absl::Nonnull<StatusRep*> StatusRep::CloneAndUnref() const {
  // Optimization: no need to create a clone if we already have a refcount of 1.
  if (ref_.load(std::memory_order_acquire) == 1) {
    // All StatusRep instances are heap allocated and mutable, therefore this
    // const_cast will never cast away const from a stack instance.
    //
    // CloneAndUnref is the only method that doesn't involve an external cast to
    // get a mutable StatusRep* from the uintptr_t rep stored in Status.
    return const_cast<StatusRep*>(this);
  }
  std::unique_ptr<status_internal::Payloads> payloads;
  if (payloads_) {
    payloads = absl::make_unique<status_internal::Payloads>(*payloads_);
  }
  auto* new_rep = new StatusRep(code_, message_, std::move(payloads));
  Unref();
  return new_rep;
}